

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerGLSL::declare_undefined_values(CompilerGLSL *this)

{
  uint id;
  bool bVar1;
  SPIRUndef *pSVar2;
  SPIRType *type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  long lVar3;
  TypedID<(spirv_cross::Types)0> *pTVar4;
  LoopLock local_b0;
  TypedID<(spirv_cross::Types)0> *local_a8;
  ParsedIR *local_a0;
  long local_98;
  string initializer;
  string local_70 [32];
  string local_50;
  
  local_a0 = &(this->super_Compiler).ir;
  ParsedIR::create_loop_hard_lock(local_a0);
  pTVar4 = (this->super_Compiler).ir.ids_for_type[0xc].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  local_98 = (this->super_Compiler).ir.ids_for_type[0xc].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size << 2;
  bVar1 = false;
  local_a8 = pTVar4;
  for (lVar3 = 0; local_98 != lVar3; lVar3 = lVar3 + 4) {
    id = *(uint *)((long)&pTVar4->id + lVar3);
    ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)((ulong)id * 0x18);
    if (*(int *)((long)&ts_1->field_2 +
                (long)(this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr) ==
        0xc) {
      pSVar2 = ParsedIR::get<spirv_cross::SPIRUndef>(local_a0,id);
      type = Compiler::get<spirv_cross::SPIRType>
                       (&this->super_Compiler,*(uint32_t *)&(pSVar2->super_IVariant).field_0xc);
      if (*(int *)&(type->super_IVariant).field_0xc != 1) {
        initializer._M_dataplus._M_p = (pointer)&initializer.field_2;
        initializer._M_string_length = 0;
        initializer.field_2._M_local_buf[0] = '\0';
        if ((this->options).force_zero_initialized_variables == true) {
          bVar1 = type_can_zero_initialize(this,type);
          if (bVar1) {
            (*(this->super_Compiler)._vptr_Compiler[0x37])
                      (local_70,this,(ulong)*(uint *)&(pSVar2->super_IVariant).field_0xc);
            join<char_const(&)[4],std::__cxx11::string>
                      (&local_50,(spirv_cross *)0x395f16,(char (*) [4])local_70,ts_1);
            ::std::__cxx11::string::operator=((string *)&initializer,(string *)&local_50);
            ::std::__cxx11::string::~string((string *)&local_50);
            ::std::__cxx11::string::~string(local_70);
          }
        }
        (*(this->super_Compiler)._vptr_Compiler[6])
                  (local_70,this,(ulong)(pSVar2->super_IVariant).self.id,1);
        (*(this->super_Compiler)._vptr_Compiler[0x1b])
                  (&local_50,this,type,local_70,(ulong)(pSVar2->super_IVariant).self.id);
        statement<std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                  (this,&local_50,&initializer,(char (*) [2])0x37e4df);
        ::std::__cxx11::string::~string((string *)&local_50);
        ::std::__cxx11::string::~string(local_70);
        ::std::__cxx11::string::~string((string *)&initializer);
        bVar1 = true;
        pTVar4 = local_a8;
      }
    }
  }
  ParsedIR::LoopLock::~LoopLock(&local_b0);
  if (bVar1) {
    statement<char_const(&)[1]>(this,(char (*) [1])0x375a3a);
  }
  return;
}

Assistant:

void CompilerGLSL::declare_undefined_values()
{
	bool emitted = false;
	ir.for_each_typed_id<SPIRUndef>([&](uint32_t, const SPIRUndef &undef) {
		auto &type = this->get<SPIRType>(undef.basetype);
		// OpUndef can be void for some reason ...
		if (type.basetype == SPIRType::Void)
			return;

		string initializer;
		if (options.force_zero_initialized_variables && type_can_zero_initialize(type))
			initializer = join(" = ", to_zero_initialized_expression(undef.basetype));

		statement(variable_decl(type, to_name(undef.self), undef.self), initializer, ";");
		emitted = true;
	});

	if (emitted)
		statement("");
}